

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O0

ECDHSecret * __thiscall
CKey::ComputeBIP324ECDHSecret
          (CKey *this,EllSwiftPubKey *their_ellswift,EllSwiftPubKey *our_ellswift,bool initiating)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  ECDHSecret *in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  bool success;
  int in_stack_00000094;
  uchar *in_stack_00000098;
  uchar *in_stack_000000a0;
  uchar *in_stack_000000a8;
  uchar *in_stack_000000b0;
  secp256k1_context *in_stack_000000b8;
  secp256k1_ellswift_xdh_hash_function in_stack_000000d0;
  void *in_stack_000000d8;
  EllSwiftPubKey *in_stack_ffffffffffffff78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                      *)in_stack_ffffffffffffff78);
  if (!bVar2) {
    __assert_fail("keydata",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                  ,0x149,
                  "ECDHSecret CKey::ComputeBIP324ECDHSecret(const EllSwiftPubKey &, const EllSwiftPubKey &, bool) const"
                 );
  }
  std::array<std::byte,_32UL>::data((array<std::byte,_32UL> *)in_stack_ffffffffffffff78);
  UCharCast((byte *)in_stack_ffffffffffffff78);
  if ((in_R8B & 1) == 0) {
    EllSwiftPubKey::data(in_stack_ffffffffffffff78);
  }
  else {
    EllSwiftPubKey::data(in_stack_ffffffffffffff78);
  }
  UCharCast((byte *)in_stack_ffffffffffffff78);
  if ((in_R8B & 1) == 0) {
    EllSwiftPubKey::data(in_stack_ffffffffffffff78);
  }
  else {
    EllSwiftPubKey::data(in_stack_ffffffffffffff78);
  }
  UCharCast((byte *)in_stack_ffffffffffffff78);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::operator->((unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                *)in_stack_ffffffffffffff78);
  std::array<unsigned_char,_32UL>::data((array<unsigned_char,_32UL> *)in_stack_ffffffffffffff78);
  iVar3 = secp256k1_ellswift_xdh
                    (in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,
                     in_stack_00000098,in_stack_00000094,in_stack_000000d0,in_stack_000000d8);
  if (iVar3 != 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return in_RDI;
    }
    __stack_chk_fail();
  }
  __assert_fail("success",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key.cpp"
                ,0x157,
                "ECDHSecret CKey::ComputeBIP324ECDHSecret(const EllSwiftPubKey &, const EllSwiftPubKey &, bool) const"
               );
}

Assistant:

ECDHSecret CKey::ComputeBIP324ECDHSecret(const EllSwiftPubKey& their_ellswift, const EllSwiftPubKey& our_ellswift, bool initiating) const
{
    assert(keydata);

    ECDHSecret output;
    // BIP324 uses the initiator as party A, and the responder as party B. Remap the inputs
    // accordingly:
    bool success = secp256k1_ellswift_xdh(secp256k1_context_sign,
                                          UCharCast(output.data()),
                                          UCharCast(initiating ? our_ellswift.data() : their_ellswift.data()),
                                          UCharCast(initiating ? their_ellswift.data() : our_ellswift.data()),
                                          keydata->data(),
                                          initiating ? 0 : 1,
                                          secp256k1_ellswift_xdh_hash_function_bip324,
                                          nullptr);
    // Should always succeed for valid keys (assert above).
    assert(success);
    return output;
}